

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O0

bool __thiscall spirv_cross::Bitset::operator==(Bitset *this,Bitset *other)

{
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  reference __x;
  value_type *v;
  const_iterator __end2;
  const_iterator __begin2;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *__range2;
  Bitset *other_local;
  Bitset *this_local;
  
  if (this->lower == other->lower) {
    sVar2 = ::std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::size(&this->higher);
    sVar3 = ::std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::size(&other->higher);
    if (sVar2 == sVar3) {
      __end2 = ::std::
               unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               ::begin(&this->higher);
      v = (value_type *)
          ::std::
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          ::end(&this->higher);
      while (bVar1 = ::std::__detail::operator!=
                               (&__end2.super__Node_iterator_base<unsigned_int,_false>,
                                (_Node_iterator_base<unsigned_int,_false> *)&v), bVar1) {
        __x = ::std::__detail::_Node_const_iterator<unsigned_int,_true,_false>::operator*(&__end2);
        sVar2 = ::std::
                unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                ::count(&other->higher,__x);
        if (sVar2 == 0) {
          return false;
        }
        ::std::__detail::_Node_const_iterator<unsigned_int,_true,_false>::operator++(&__end2);
      }
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

inline bool operator==(const Bitset &other) const
	{
		if (lower != other.lower)
			return false;

		if (higher.size() != other.higher.size())
			return false;

		for (auto &v : higher)
			if (other.higher.count(v) == 0)
				return false;

		return true;
	}